

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleStringInternalCache.cpp
# Opt level: O0

void __thiscall
SimpleStringInternalCache::releaseCachedBlockFrom
          (SimpleStringInternalCache *this,char *memory,SimpleStringInternalCacheNode *node)

{
  SimpleStringMemoryBlock *pSVar1;
  SimpleStringMemoryBlock *blockToFree;
  SimpleStringMemoryBlock *block_1;
  SimpleStringMemoryBlock *block;
  SimpleStringInternalCacheNode *node_local;
  char *memory_local;
  SimpleStringInternalCache *this_local;
  
  if ((node->usedMemoryHead_ == (SimpleStringMemoryBlock *)0x0) ||
     (node->usedMemoryHead_->memory_ != memory)) {
    for (blockToFree = node->usedMemoryHead_; blockToFree != (SimpleStringMemoryBlock *)0x0;
        blockToFree = blockToFree->next_) {
      if ((blockToFree->next_ != (SimpleStringMemoryBlock *)0x0) &&
         (blockToFree->next_->memory_ == memory)) {
        pSVar1 = blockToFree->next_;
        blockToFree->next_ = blockToFree->next_->next_;
        pSVar1 = addToSimpleStringMemoryBlockList(this,pSVar1,node->freeMemoryHead_);
        node->freeMemoryHead_ = pSVar1;
        return;
      }
    }
    printDeallocatingUnknownMemory(this,memory);
  }
  else {
    pSVar1 = node->usedMemoryHead_;
    node->usedMemoryHead_ = node->usedMemoryHead_->next_;
    pSVar1 = addToSimpleStringMemoryBlockList(this,pSVar1,node->freeMemoryHead_);
    node->freeMemoryHead_ = pSVar1;
  }
  return;
}

Assistant:

void SimpleStringInternalCache::releaseCachedBlockFrom(char* memory, SimpleStringInternalCacheNode* node)
{
    if (node->usedMemoryHead_ && node->usedMemoryHead_->memory_ == memory) {
        SimpleStringMemoryBlock* block = node->usedMemoryHead_;
        node->usedMemoryHead_ = node->usedMemoryHead_->next_;
        node->freeMemoryHead_ = addToSimpleStringMemoryBlockList(block, node->freeMemoryHead_);
        return;
    }

    for (SimpleStringMemoryBlock* block = node->usedMemoryHead_; block; block = block->next_) {
        if (block->next_ && block->next_->memory_ == memory) {
            SimpleStringMemoryBlock* blockToFree = block->next_;
            block->next_ = block->next_->next_;
            node->freeMemoryHead_ = addToSimpleStringMemoryBlockList(blockToFree, node->freeMemoryHead_);
            return;
        }
    }
    printDeallocatingUnknownMemory(memory);

}